

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

errr parser_reg(parser *p,char *fmt,_func_parser_error_parser_ptr *func)

{
  parser_hook *h_00;
  char *fmt_00;
  parser_hook *h;
  char *cfmt;
  errr r;
  _func_parser_error_parser_ptr *func_local;
  char *fmt_local;
  parser *p_local;
  
  if (p == (parser *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/parser.c"
                  ,0x1eb,
                  "errr parser_reg(struct parser *, const char *, enum parser_error (*)(struct parser *))"
                 );
  }
  if (fmt != (char *)0x0) {
    if (func != (_func_parser_error_parser_ptr *)0x0) {
      h_00 = (parser_hook *)mem_alloc(0x28);
      fmt_00 = string_make(fmt);
      h_00->next = p->hooks;
      h_00->func = func;
      p_local._4_4_ = parse_specs(h_00,fmt_00);
      if (p_local._4_4_ == 0) {
        p->hooks = h_00;
        mem_free(fmt_00);
        p_local._4_4_ = 0;
      }
      else {
        mem_free(h_00);
        mem_free(fmt_00);
      }
      return p_local._4_4_;
    }
    __assert_fail("func",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/parser.c"
                  ,0x1ed,
                  "errr parser_reg(struct parser *, const char *, enum parser_error (*)(struct parser *))"
                 );
  }
  __assert_fail("fmt",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/parser.c"
                ,0x1ec,
                "errr parser_reg(struct parser *, const char *, enum parser_error (*)(struct parser *))"
               );
}

Assistant:

errr parser_reg(struct parser *p, const char *fmt,
                enum parser_error (*func)(struct parser *p)) {
	errr r;
	char *cfmt;
	struct parser_hook *h;

	assert(p);
	assert(fmt);
	assert(func);

	h = mem_alloc(sizeof *h);
	cfmt = string_make(fmt);
	h->next = p->hooks;
	h->func = func;
	r = parse_specs(h, cfmt);
	if (r)
	{
		mem_free(h);
		mem_free(cfmt);
		return r;
	}

	p->hooks = h;
	mem_free(cfmt);
	return 0;
}